

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::analyze_non_block_pointer_types(Compiler *this)

{
  bool bVar1;
  uint32_t id;
  SPIRFunction *func;
  size_type count;
  reference puVar2;
  uint *__first;
  uint *__last;
  uint local_104;
  _Node_iterator_base<unsigned_int,_false> _Stack_100;
  uint type;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  PhysicalStorageBufferPointerHandler *local_e0;
  undefined1 local_c8 [8];
  PhysicalStorageBufferPointerHandler handler;
  Compiler *this_local;
  
  handler.access_chain_to_physical_block._M_h._M_single_bucket = (__node_base_ptr)this;
  PhysicalStorageBufferPointerHandler::PhysicalStorageBufferPointerHandler
            ((PhysicalStorageBufferPointerHandler *)local_c8,this);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_c8);
  local_e0 = (PhysicalStorageBufferPointerHandler *)local_c8;
  __range1 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::Compiler::analyze_non_block_pointer_types()::__0>
            (&this->ir,(anon_class_16_2_f77679f7 *)&__range1);
  count = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::size((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&handler.compiler);
  SmallVector<unsigned_int,_8UL>::reserve(&this->physical_storage_non_block_pointer_types,count);
  __end1 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&handler.compiler);
  _Stack_100._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&handler.compiler);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff00);
    if (!bVar1) break;
    puVar2 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end1);
    local_104 = *puVar2;
    SmallVector<unsigned_int,_8UL>::push_back
              (&this->physical_storage_non_block_pointer_types,&local_104);
    ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end1);
  }
  __first = ::std::begin<spirv_cross::SmallVector<unsigned_int,8ul>>
                      (&this->physical_storage_non_block_pointer_types);
  __last = ::std::end<spirv_cross::SmallVector<unsigned_int,8ul>>
                     (&this->physical_storage_non_block_pointer_types);
  ::std::sort<unsigned_int*>(__first,__last);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
  ::operator=(&this->physical_storage_type_to_alignment,
              (unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
               *)&handler.non_block_types._M_h._M_single_bucket);
  PhysicalStorageBufferPointerHandler::~PhysicalStorageBufferPointerHandler
            ((PhysicalStorageBufferPointerHandler *)local_c8);
  return;
}

Assistant:

void Compiler::analyze_non_block_pointer_types()
{
	PhysicalStorageBufferPointerHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Analyze any block declaration we have to make. It might contain
	// physical pointers to POD types which we never used, and thus never added to the list.
	// We'll need to add those pointer types to the set of types we declare.
	ir.for_each_typed_id<SPIRType>([&](uint32_t, SPIRType &type) {
		if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
			handler.analyze_non_block_types_from_block(type);
	});

	physical_storage_non_block_pointer_types.reserve(handler.non_block_types.size());
	for (auto type : handler.non_block_types)
		physical_storage_non_block_pointer_types.push_back(type);
	sort(begin(physical_storage_non_block_pointer_types), end(physical_storage_non_block_pointer_types));
	physical_storage_type_to_alignment = std::move(handler.physical_block_type_meta);
}